

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall
opengv::math::Bracket::divide
          (Bracket *this,
          list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *brackets)

{
  double upperBound;
  Bracket *this_00;
  Bracket *this_01;
  value_type *in_RDI;
  Ptr upperBracket;
  Ptr lowerBracket;
  double center;
  Bracket *in_stack_ffffffffffffff98;
  shared_ptr<opengv::math::Bracket> *in_stack_ffffffffffffffa0;
  
  upperBound = ((double)in_RDI[1].
                        super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + (double)(in_RDI->
                         super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi) * 0.5;
  this_00 = (Bracket *)operator_new(0x30);
  Bracket(this_00,(double)(in_RDI->
                          super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi,upperBound,
          (size_t)in_RDI[2].super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,false);
  std::shared_ptr<opengv::math::Bracket>::shared_ptr<opengv::math::Bracket,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = (Bracket *)operator_new(0x30);
  Bracket(this_01,upperBound,
          (double)in_RDI[1].super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,
          (size_t)in_RDI[2].super___shared_ptr<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi,true);
  std::shared_ptr<opengv::math::Bracket>::shared_ptr<opengv::math::Bracket,void>
            ((shared_ptr<opengv::math::Bracket> *)this_01,in_stack_ffffffffffffff98);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               *)this_00,in_RDI);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               *)this_00,in_RDI);
  std::shared_ptr<opengv::math::Bracket>::~shared_ptr
            ((shared_ptr<opengv::math::Bracket> *)0x12f291c);
  std::shared_ptr<opengv::math::Bracket>::~shared_ptr
            ((shared_ptr<opengv::math::Bracket> *)0x12f2926);
  return;
}

Assistant:

void
opengv::math::Bracket::divide( std::list<Ptr> & brackets ) const
{
  double center = (_upperBound + _lowerBound) / 2.0;
  Ptr lowerBracket(new Bracket(_lowerBound,center,_lowerBoundChanges,false));
  Ptr upperBracket(new Bracket(center,_upperBound,_upperBoundChanges,true));
  brackets.push_back(lowerBracket);
  brackets.push_back(upperBracket);
}